

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O3

void __thiscall
DListBase<Js::RecyclableObject_*,_RealCount>::Clear<Memory::HeapAllocator>
          (DListBase<Js::RecyclableObject_*,_RealCount> *this,HeapAllocator *allocator)

{
  DListNode<Js::RecyclableObject_*> *pDVar1;
  DListNode<Js::RecyclableObject_*> *buffer;
  
  buffer = (this->super_DListNodeBase<Js::RecyclableObject_*>).next.node;
  while (buffer != (DListNode<Js::RecyclableObject_*> *)this) {
    pDVar1 = (buffer->super_DListNodeBase<Js::RecyclableObject_*>).next.node;
    Memory::HeapAllocator::Free(allocator,buffer,0x18);
    buffer = pDVar1;
  }
  (this->super_DListNodeBase<Js::RecyclableObject_*>).next.list = this;
  (this->super_DListNodeBase<Js::RecyclableObject_*>).prev.list = this;
  (this->super_RealCount).count = 0;
  return;
}

Assistant:

void Clear(TAllocator * allocator)
    {
        NodeBase * current = this->Next();
        while (!this->IsHead(current))
        {
            NodeBase * next = current->Next();
            AllocatorDelete(TAllocator, allocator, (Node *)current);
            current = next;
        }

        this->Next() = this;
        this->Prev() = this;
        this->SetCount(0);
    }